

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  int iVar1;
  undefined1 local_f8 [8];
  lua_longjmp lj;
  void *ud_local;
  Pfunc f_local;
  lua_State *L_local;
  
  lj.b[0].__saved_mask.__val[0xf]._0_4_ = 0;
  local_f8 = (undefined1  [8])L->errorJmp;
  L->errorJmp = (lua_longjmp *)local_f8;
  lj._208_8_ = ud;
  iVar1 = _setjmp((__jmp_buf_tag *)&lj);
  if (iVar1 == 0) {
    (*f)(L,(void *)lj._208_8_);
  }
  L->errorJmp = (lua_longjmp *)local_f8;
  return (int)lj.b[0].__saved_mask.__val[0xf];
}

Assistant:

static int luaD_rawrunprotected(lua_State*L,Pfunc f,void*ud){
struct lua_longjmp lj;
lj.status=0;
lj.previous=L->errorJmp;
L->errorJmp=&lj;
LUAI_TRY(L,&lj,
(*f)(L,ud);
);
L->errorJmp=lj.previous;
return lj.status;
}